

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_addsub(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *s_00;
  uintptr_t o_1;
  TCGv_i32 pTVar1;
  TCGTemp *a1;
  TCGv_i32 arg2;
  uint reg0;
  uintptr_t o_2;
  TCGv_i32 pTVar2;
  int iVar3;
  uint32_t dest;
  int mode;
  uint mode_00;
  uint uVar4;
  uintptr_t o;
  bool bVar5;
  TCGv_i32 addr;
  
  s_00 = s->uc->tcg_ctx;
  opsize = *(int *)(&DAT_00d886a4 + (insn >> 4 & 0xc));
  uVar4 = insn >> 9 & 7;
  pTVar1 = gen_extend(s,s_00->cpu_dregs[uVar4],opsize,1);
  a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  bVar5 = (((s->base).tb)->flags & 0x2000) == 0;
  mode_00 = insn >> 3 & 7;
  reg0 = insn & 7;
  if ((insn >> 8 & 1) == 0) {
    arg2 = gen_ea_mode(env,s,mode_00,reg0,opsize,s_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                       (uint)bVar5);
    if (arg2 == s_00->NULL_QREG) {
      gen_exception(s,(s->base).pc_next,3);
      return;
    }
LAB_006fafef:
    pTVar2 = (TCGv_i32)((long)a1 - (long)s_00);
    if ((insn >> 0xe & 1) == 0) {
      tcg_gen_setcond_i32_m68k(s_00,TCG_COND_LTU,QREG_CC_X,pTVar1,arg2);
      tcg_gen_sub_i32(s_00,pTVar2,pTVar1,arg2);
      iVar3 = 5;
    }
    else {
      tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)(pTVar1 + (long)s_00),
                       (TCGArg)(arg2 + (long)&s_00->pool_cur));
      tcg_gen_setcond_i32_m68k(s_00,TCG_COND_LTU,QREG_CC_X,pTVar2,arg2);
      iVar3 = 2;
    }
    set_cc_op(s,iVar3 + opsize);
    gen_update_cc_add(s_00,pTVar2,arg2,opsize);
    if ((insn >> 8 & 1) == 0) {
      gen_partset_reg(s_00,opsize,s_00->cpu_dregs[uVar4],pTVar2);
    }
    else {
      pTVar1 = gen_ea_mode(env,s,mode_00,reg0,opsize,pTVar2,&addr,EA_STORE,
                           (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
      if (pTVar1 == s_00->NULL_QREG) {
        dest = (s->base).pc_next;
        goto LAB_006fb13b;
      }
    }
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
  }
  else {
    pTVar2 = gen_ea_mode(env,s,mode_00,reg0,opsize,s_00->NULL_QREG,&addr,EA_LOADS,(uint)bVar5);
    arg2 = pTVar1;
    pTVar1 = pTVar2;
    if (pTVar2 != s_00->NULL_QREG) goto LAB_006fafef;
    dest = (s->base).pc_next;
LAB_006fb13b:
    gen_exception(s,dest,3);
  }
  return;
}

Assistant:

DISAS_INSN(addsub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv dest;
    TCGv src;
    TCGv tmp;
    TCGv addr;
    int add;
    int opsize;

    add = (insn & 0x4000) != 0;
    opsize = insn_opsize(insn);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);
    dest = tcg_temp_new(tcg_ctx);
    if (insn & 0x100) {
        SRC_EA(env, tmp, opsize, 1, &addr);
        src = reg;
    } else {
        tmp = reg;
        SRC_EA(env, src, opsize, 1, NULL);
    }
    if (add) {
        tcg_gen_add_i32(tcg_ctx, dest, tmp, src);
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, src);
        set_cc_op(s, CC_OP_ADDB + opsize);
    } else {
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, tmp, src);
        tcg_gen_sub_i32(tcg_ctx, dest, tmp, src);
        set_cc_op(s, CC_OP_SUBB + opsize);
    }
    gen_update_cc_add(tcg_ctx, dest, src, opsize);
    if (insn & 0x100) {
        DEST_EA(env, insn, opsize, dest, &addr);
    } else {
        gen_partset_reg(tcg_ctx, opsize, DREG(insn, 9), dest);
    }
    tcg_temp_free(tcg_ctx, dest);
}